

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestRunStats::TestRunStats
          (TestRunStats *this,TestRunInfo *_runInfo,Totals *_totals,bool _aborting)

{
  byte bVar1;
  byte in_CL;
  void *in_RDX;
  TestRunInfo *in_RDI;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  *(undefined ***)&in_RDI->name = &PTR__TestRunStats_00318c80;
  TestRunInfo::TestRunInfo
            ((TestRunInfo *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),in_RDI);
  memcpy(&in_RDI[1].name._M_string_length,in_RDX,0x38);
  in_RDI[3].name._M_dataplus = (_Alloc_hider)(bVar1 & 1);
  return;
}

Assistant:

TestRunStats::TestRunStats(   TestRunInfo const& _runInfo,
                    Totals const& _totals,
                    bool _aborting )
    :   runInfo( _runInfo ),
        totals( _totals ),
        aborting( _aborting )
    {}